

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.cpp
# Opt level: O2

Builder * embree::sse2::BVH4InstanceArrayMeshBuilderSAH
                    (void *bvh,InstanceArray *mesh,GTypeMask gtype,uint geomID,size_t mode)

{
  BVHNBuilderSAH<4,_embree::InstanceArrayPrimitive> *this;
  
  this = (BVHNBuilderSAH<4,_embree::InstanceArrayPrimitive> *)::operator_new(0xa8);
  BVHNBuilderSAH<4,_embree::InstanceArrayPrimitive>::BVHNBuilderSAH
            (this,(BVH *)bvh,&mesh->super_Geometry,geomID,4,1.0,1,1,gtype);
  return &this->super_Builder;
}

Assistant:

Builder* BVH4InstanceArrayMeshBuilderSAH (void* bvh, InstanceArray* mesh, Geometry::GTypeMask gtype, unsigned int geomID, size_t mode) {
      return new BVHNBuilderSAH<4,InstanceArrayPrimitive>((BVH4*)bvh,mesh,geomID,4,1.0f,1,1,gtype);
    }